

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_lsr_zeropagex_sets_reg_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::CpuZeropageIndexedTest_lsr_zeropagex_sets_reg_Test>
           *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x118);
  anon_unknown.dwarf_26fab4::CpuZeropageIndexedTest::CpuZeropageIndexedTest
            ((CpuZeropageIndexedTest *)this_00);
  (((CpuTest *)&this_00->_vptr_Test)->super_Test)._vptr_Test = (_func_int **)&PTR__CpuTest_00271758;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }